

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.hpp
# Opt level: O2

void duckdb::StringStats::Merge(BaseStatistics *stats,BaseStatistics *other)

{
  data_t *data;
  data_t *comparison;
  LogicalTypeId LVar1;
  uint uVar2;
  undefined1 uVar3;
  int iVar4;
  bool bVar5;
  uint uVar6;
  
  LVar1 = (other->type).id_;
  if ((LVar1 != SQLNULL) && (LVar1 != VALIDITY)) {
    iVar4 = StringValueComparison
                      ((const_data_ptr_t)&other->stats_union,8,(const_data_ptr_t)&stats->stats_union
                      );
    if (iVar4 < 0) {
      *(undefined8 *)(stats->stats_union).string_data.min =
           *(undefined8 *)(other->stats_union).string_data.min;
    }
    data = (other->stats_union).string_data.max;
    comparison = (stats->stats_union).string_data.max;
    iVar4 = StringValueComparison(data,8,comparison);
    if (0 < iVar4) {
      *(undefined8 *)comparison = *(undefined8 *)data;
    }
    if ((stats->stats_union).string_data.has_unicode == false) {
      uVar3 = (undefined1)*(undefined4 *)((long)&other->stats_union + 0x10);
    }
    else {
      uVar3 = true;
    }
    (stats->stats_union).string_data.has_unicode = (bool)uVar3;
    bVar5 = false;
    if ((stats->stats_union).string_data.has_max_string_length != false) {
      bVar5 = (other->stats_union).string_data.has_max_string_length;
    }
    (stats->stats_union).string_data.has_max_string_length = bVar5;
    uVar2 = (stats->stats_union).string_data.max_string_length;
    uVar6 = (other->stats_union).string_data.max_string_length;
    if (uVar6 < uVar2) {
      uVar6 = uVar2;
    }
    (stats->stats_union).string_data.max_string_length = uVar6;
  }
  return;
}

Assistant:

inline LogicalTypeId id() const { // NOLINT: mimic std casing
		return id_;
	}